

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createMap.hpp
# Opt level: O3

map<int,_njoy::ENDFtk::tree::Section,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
* __thiscall
njoy::ENDFtk::tree::File::createMap<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (map<int,_njoy::ENDFtk::tree::Section,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::Section>_>_>
           *__return_storage_ptr__,File *this,HEAD *head,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *position,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *end,long *lineNumber)

{
  int args_1;
  undefined8 uVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  undefined8 *puVar4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  int iVar7;
  StructureDivision local_c8;
  _Rb_tree_header *local_80;
  undefined1 local_78 [48];
  int local_48 [2];
  int local_40;
  
  local_80 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &local_80->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  end->_M_current = end->_M_current + -1;
  *(HEAD **)begin._M_current = head;
  StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_c8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)begin._M_current,position,(long *)end);
  args_1 = *(int *)((long)&(this->sections_)._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  if (((local_c8.tail.fields._M_elems[2] != 0) && (local_c8.tail.fields._M_elems[1] != 0)) &&
     (local_c8.tail.fields._M_elems[0] != 0)) {
    iVar5 = local_c8.tail.fields._M_elems[1];
    while (iVar5 == args_1) {
      p_Var3 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = local_80;
      if (p_Var3 != (_Base_ptr)0x0) {
        do {
          if (local_c8.tail.fields._M_elems[2] <= (int)*(size_t *)(p_Var3 + 1)) {
            p_Var6 = (_Rb_tree_header *)p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)
                   [(int)*(size_t *)(p_Var3 + 1) < local_c8.tail.fields._M_elems[2]];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((p_Var6 != local_80) && ((int)p_Var6->_M_node_count <= local_c8.tail.fields._M_elems[2])
           ) {
          tools::Log::error<char_const*,int>
                    ("Found a duplicate section for MT{}",local_c8.tail.fields._M_elems[2]);
          tools::Log::info<char_const*,int,int,int,long>
                    ("Current position: MAT{} MF{} MT{} at line {}",local_c8.tail.fields._M_elems[0]
                     ,local_c8.tail.fields._M_elems[1],local_c8.tail.fields._M_elems[2],
                     (long)end->_M_current);
          goto LAB_00139fb5;
        }
      }
      Section::Section<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((Section *)local_78,(HEAD *)&local_c8,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)begin._M_current,position,(long *)end);
      std::
      _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
      ::_M_emplace_unique<int&,njoy::ENDFtk::tree::Section>
                ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::tree::Section>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::tree::Section>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::tree::Section>>>
                  *)__return_storage_ptr__,local_c8.tail.fields._M_elems + 2,(Section *)local_78);
      if ((undefined1 *)local_78._16_8_ != local_78 + 0x20) {
        operator_delete((void *)local_78._16_8_,local_78._32_8_ + 1);
      }
      head = *(HEAD **)begin._M_current;
      if (position->_M_current <= head) {
        tools::Log::error<char_const*>
                  ("Encountered the end of stream before a FEND record was found");
LAB_00139fb5:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = getenv;
        __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
      }
      StructureDivision::StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((StructureDivision *)local_78,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)begin._M_current,position,(long *)end);
      do {
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
        super__Head_base<5UL,_long,_false>._M_head_impl =
             (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)local_78._0_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
             local_78._8_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl = local_78._16_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
        _M_head_impl = local_78._24_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl = (double)local_78._32_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl = (double)local_78._40_8_;
        local_c8.tail.fields._M_elems._0_8_ = local_48;
        local_c8.tail.fields._M_elems[2] = local_40;
        bVar2 = StructureDivision::isSendPermissive(&local_c8);
        iVar5 = local_c8.tail.fields._M_elems[1];
        iVar7 = local_c8.tail.fields._M_elems[0];
        uVar1 = local_c8.tail.fields._M_elems._0_8_;
        if ((!bVar2 || local_c8.tail.fields._M_elems[1] == 0) ||
           (local_c8.tail.fields._M_elems[0] < 1)) goto LAB_00139f2c;
        head = *(HEAD **)begin._M_current;
        StructureDivision::
        StructureDivision<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                  ((StructureDivision *)local_78,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )head,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)begin._M_current,position,(long *)end);
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
        _M_head_impl = (double)local_78._32_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Head_base<0UL,_double,_false>._M_head_impl = (double)local_78._40_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Head_base<3UL,_long,_false>._M_head_impl = local_78._16_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
        _M_head_impl = local_78._24_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
        super__Head_base<5UL,_long,_false>._M_head_impl =
             (_Head_base<5UL,_long,_false>)(_Head_base<5UL,_long,_false>)local_78._0_8_;
        local_c8.base.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
        super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
             local_78._8_8_;
        local_c8.tail.fields._M_elems[2] = local_40;
        local_c8.tail.fields._M_elems[0] = local_48[0];
        local_c8.tail.fields._M_elems[1] = local_48[1];
        uVar1 = local_c8.tail.fields._M_elems._0_8_;
      } while (*begin._M_current < position->_M_current);
      local_c8.tail.fields._M_elems[0] = local_48[0];
      local_c8.tail.fields._M_elems[1] = local_48[1];
      iVar5 = local_c8.tail.fields._M_elems[1];
      iVar7 = local_c8.tail.fields._M_elems[0];
LAB_00139f2c:
      local_c8.tail.fields._M_elems._0_8_ = uVar1;
      if (((local_c8.tail.fields._M_elems[2] == 0) || (iVar5 == 0)) || (iVar7 == 0)) break;
    }
  }
  bVar2 = StructureDivision::isSendPermissive(&local_c8);
  if ((!bVar2 || local_c8.tail.fields._M_elems[1] != 0) || (local_c8.tail.fields._M_elems[0] < 1)) {
    *(HEAD **)begin._M_current = head;
    tools::Log::info<char_const*,int>("The FEND record for MF{} appears to be missing",args_1);
    tools::Log::info<char_const*,int,int,int,long>
              ("Current position: MAT{} MF{} MT{} at line {}",local_c8.tail.fields._M_elems[0],
               local_c8.tail.fields._M_elems[1],local_c8.tail.fields._M_elems[2],
               (long)end->_M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::map< int, Section >
createMap
( const HEAD& head, BufferIterator begin,
  BufferIterator& position, const BufferIterator& end, long& lineNumber ){

  std::map< int, Section > sections;

  // read the first HEAD record (we need a structure division)
  --lineNumber;
  position = begin;
  auto division = StructureDivision( position, end, lineNumber );

  // continue reading sections for the same mf
  auto mf = head.MF();
  while ( division.isHead() && ( division.tail.MF() == mf ) ) {

    // check for duplicate mt
    if ( sections.count( division.tail.MT() ) ) {

      Log::error( "Found a duplicate section for MT{}", division.tail.MT() );
      Log::info( "Current position: MAT{} MF{} MT{} at line {}",
                 division.tail.MAT(), division.tail.MF(), division.tail.MT(),
                 lineNumber );
      throw std::exception();
    }

    // add the section
    sections.emplace( division.tail.MT(),
                      Section( asHead( division ),
                               begin, position, end, lineNumber ) );

    // check for end of stream
    if ( position >= end ) {

      Log::error( "Encountered the end of stream before a FEND record was found" );
      throw std::exception();
    }

    // skip any duplicate SEND records
    begin = position;
    division = StructureDivision( position, end, lineNumber );

    while ( division.isSend() ) {

      begin = position;
      division = StructureDivision( position, end, lineNumber );
      if ( position >= end ) {

        break;
      }
    }
  }

  // warn for missing FEND record
  if ( !division.isFend() ) {

    position = begin;
    Log::info( "The FEND record for MF{} appears to be missing", mf );
    Log::info( "Current position: MAT{} MF{} MT{} at line {}",
               division.tail.MAT(), division.tail.MF(), division.tail.MT(),
               lineNumber );
  }

  return sections;
}